

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void sysbvm_primitiveTable_registerFunction
               (sysbvm_functionEntryPoint_t primitiveEntryPoint,char *primitiveName)

{
  ulong local_20;
  size_t i;
  char *primitiveName_local;
  sysbvm_functionEntryPoint_t primitiveEntryPoint_local;
  
  local_20 = 0;
  while( true ) {
    if (sysbvm_primitiveTableSize <= local_20) {
      if (0x3ff < sysbvm_primitiveTableSize) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:42: assertion failure: sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY"
                  );
      }
      sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
      sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
      sysbvm_primitiveTableSize = sysbvm_primitiveTableSize + 1;
      return;
    }
    if (sysbvm_primitiveTable[local_20].entryPoint == primitiveEntryPoint) break;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void sysbvm_primitiveTable_registerFunction(sysbvm_functionEntryPoint_t primitiveEntryPoint, const char *primitiveName)
{
    for(size_t i = 0; i < sysbvm_primitiveTableSize; ++i)
    {
        if(sysbvm_primitiveTable[i].entryPoint == primitiveEntryPoint)
            return;
    }

    SYSBVM_ASSERT(sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY);
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
    ++sysbvm_primitiveTableSize;
}